

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest_lib.cpp
# Opt level: O0

void use_valarray(void)

{
  value_type vVar1;
  bool bVar2;
  long *plVar3;
  iterator __first;
  iterator __last;
  size_type sVar4;
  reference pvVar5;
  double *pdVar6;
  ostream *poVar7;
  void *this;
  value_type local_c0;
  _BinBase1<std::__multiplies,_std::valarray<double>_> local_b8;
  _Expr<std::__detail::_BinClos<std::__plus,_std::_ValArray,_std::_Expr,_double,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_double,_double>_>,_double>
  local_a8;
  undefined1 local_90 [8];
  valarray<double> results;
  undefined1 local_78 [8];
  valarray<double> sqrt_num;
  undefined1 local_60 [4];
  int i;
  valarray<double> numbers;
  int size;
  double local_28;
  double temp;
  vector<double,_std::allocator<double>_> data;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp);
  std::operator<<((ostream *)&std::cout,"Enter numbers (<0 to quit):\n");
  while( true ) {
    plVar3 = (long *)std::istream::operator>>(&std::cin,&local_28);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar2 || local_28 < 0.0) break;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&temp,&local_28);
  }
  __first = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)&temp);
  __last = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)&temp);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current);
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)&temp);
  numbers._M_data._4_4_ = (int)sVar4;
  std::valarray<double>::valarray((valarray<double> *)local_60,(long)numbers._M_data._4_4_);
  for (sqrt_num._M_data._4_4_ = 0; sqrt_num._M_data._4_4_ < numbers._M_data._4_4_;
      sqrt_num._M_data._4_4_ = sqrt_num._M_data._4_4_ + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&temp,
                        (long)sqrt_num._M_data._4_4_);
    vVar1 = *pvVar5;
    pdVar6 = std::valarray<double>::operator[]
                       ((valarray<double> *)local_60,(long)sqrt_num._M_data._4_4_);
    *pdVar6 = vVar1;
  }
  std::valarray<double>::valarray((valarray<double> *)local_78,(long)numbers._M_data._4_4_);
  results._M_data = (double *)std::sqrt<double>((valarray<double> *)local_60);
  std::valarray<double>::operator=
            ((valarray<double> *)local_78,
             (_Expr<std::__detail::_UnClos<std::_Sqrt,_std::_ValArray,_double>,_double> *)
             &results._M_data);
  std::valarray<double>::valarray((valarray<double> *)local_90,(long)numbers._M_data._4_4_);
  local_c0 = 2.0;
  local_b8 = (_BinBase1<std::__multiplies,_std::valarray<double>_>)
             std::operator*(&local_c0,(valarray<double> *)local_78);
  std::operator+(&local_a8,(valarray<double> *)local_60,
                 (_Expr<std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_double,_double>,_double>
                  *)&local_b8);
  std::valarray<double>::operator=((valarray<double> *)local_90,&local_a8);
  std::ios_base::setf((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_fixed);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),4);
  for (sqrt_num._M_data._4_4_ = 0; sqrt_num._M_data._4_4_ < numbers._M_data._4_4_;
      sqrt_num._M_data._4_4_ = sqrt_num._M_data._4_4_ + 1) {
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),8);
    pdVar6 = std::valarray<double>::operator[]
                       ((valarray<double> *)local_60,(long)sqrt_num._M_data._4_4_);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar6);
    std::operator<<(poVar7,": ");
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),8);
    pdVar6 = std::valarray<double>::operator[]
                       ((valarray<double> *)local_90,(long)sqrt_num._M_data._4_4_);
    this = (void *)std::ostream::operator<<(&std::cout,*pdVar6);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::valarray<double>::~valarray((valarray<double> *)local_90);
  std::valarray<double>::~valarray((valarray<double> *)local_78);
  std::valarray<double>::~valarray((valarray<double> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&temp);
  return;
}

Assistant:

void use_valarray() {
    using namespace std;
    vector<double> data;
    double temp;

    cout << "Enter numbers (<0 to quit):\n";
    while(cin >> temp && temp >= 0) {
        data.push_back(temp);
    }

    sort(data.begin(), data.end());

    int size = data.size();

    // had to decide size
    valarray<double> numbers(size);
    int i = 0;
    for(i = 0; i < size; i++) {
        numbers[i] = data[i];
    }
    valarray<double> sqrt_num(size);
    sqrt_num = sqrt(numbers);

    valarray<double> results(size);
    //  must be 'T' * valarray<T>
    results = numbers + 2.0 * sqrt_num;
    cout.setf(ios_base::fixed);
    cout.precision(4);
    for(i = 0; i < size; i++) {
        cout.width(8);
        cout << numbers[i] << ": ";
        cout.width(8);
        cout << results[i] << endl;
    }
}